

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractscrollarea.cpp
# Opt level: O0

void QtMWidgets::AbstractScrollArea::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  ScrollIndicatorPolicy *pSVar1;
  ScrollIndicatorPolicy SVar2;
  QColor *pQVar3;
  QColor QVar4;
  void *_v_1;
  AbstractScrollArea *_t_2;
  ScrollIndicatorPolicy local_50;
  undefined2 uStack_4c;
  void *_v;
  AbstractScrollArea *_t_1;
  AbstractScrollArea *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      _q_animateScrollIndicators((AbstractScrollArea *)_o);
      break;
    case 1:
      _q_kineticScrolling((AbstractScrollArea *)_o,*_a[1],*_a[2]);
      break;
    case 2:
      _q_kineticScrollingAboutToStart((AbstractScrollArea *)_o);
      break;
    case 3:
      _q_kineticScrollingFinished((AbstractScrollArea *)_o);
      break;
    case 4:
      _q_horBlurAnim((AbstractScrollArea *)_o,(QVariant *)_a[1]);
      break;
    case 5:
      _q_horBlurAnimFinished((AbstractScrollArea *)_o);
      break;
    case 6:
      _q_vertBlurAnim((AbstractScrollArea *)_o,(QVariant *)_a[1]);
      break;
    case 7:
      _q_vertBlurAnimFinished((AbstractScrollArea *)_o);
      break;
    case 8:
      _q_startBlurAnim((AbstractScrollArea *)_o);
    }
  }
  else if (_c == ReadProperty) {
    pSVar1 = (ScrollIndicatorPolicy *)*_a;
    switch(_id) {
    case 0:
      QVar4 = indicatorColor((AbstractScrollArea *)_o);
      _t_2 = QVar4._0_8_;
      local_50 = QVar4.ct._4_4_;
      uStack_4c = QVar4.ct._8_2_;
      *(AbstractScrollArea **)pSVar1 = _t_2;
      pSVar1[2] = local_50;
      *(undefined2 *)(pSVar1 + 3) = uStack_4c;
      break;
    case 1:
      SVar2 = verticalScrollIndicatorPolicy((AbstractScrollArea *)_o);
      *pSVar1 = SVar2;
      break;
    case 2:
      SVar2 = horizontalScrollIndicatorPolicy((AbstractScrollArea *)_o);
      *pSVar1 = SVar2;
      break;
    case 3:
      pQVar3 = blurColor((AbstractScrollArea *)_o);
      *(undefined8 *)pSVar1 = *(undefined8 *)pQVar3;
      pSVar1[2] = *(ScrollIndicatorPolicy *)((long)&pQVar3->ct + 4);
      *(ushort *)(pSVar1 + 3) = (pQVar3->ct).argb.pad;
      break;
    case 4:
      SVar2 = blurPolicy((AbstractScrollArea *)_o);
      *pSVar1 = SVar2;
    }
  }
  else if (_c == WriteProperty) {
    pQVar3 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setIndicatorColor((AbstractScrollArea *)_o,pQVar3);
      break;
    case 1:
      setVerticalScrollIndicatorPolicy((AbstractScrollArea *)_o,pQVar3->cspec);
      break;
    case 2:
      setHorizontalScrollIndicatorPolicy((AbstractScrollArea *)_o,pQVar3->cspec);
      break;
    case 3:
      setBlurColor((AbstractScrollArea *)_o,pQVar3);
      break;
    case 4:
      setBlurPolicy((AbstractScrollArea *)_o,pQVar3->cspec);
    }
  }
  return;
}

Assistant:

void QtMWidgets::AbstractScrollArea::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AbstractScrollArea *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->_q_animateScrollIndicators(); break;
        case 1: _t->_q_kineticScrolling((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 2: _t->_q_kineticScrollingAboutToStart(); break;
        case 3: _t->_q_kineticScrollingFinished(); break;
        case 4: _t->_q_horBlurAnim((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        case 5: _t->_q_horBlurAnimFinished(); break;
        case 6: _t->_q_vertBlurAnim((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        case 7: _t->_q_vertBlurAnimFinished(); break;
        case 8: _t->_q_startBlurAnim(); break;
        default: ;
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<AbstractScrollArea *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QColor*>(_v) = _t->indicatorColor(); break;
        case 1: *reinterpret_cast< ScrollIndicatorPolicy*>(_v) = _t->verticalScrollIndicatorPolicy(); break;
        case 2: *reinterpret_cast< ScrollIndicatorPolicy*>(_v) = _t->horizontalScrollIndicatorPolicy(); break;
        case 3: *reinterpret_cast< QColor*>(_v) = _t->blurColor(); break;
        case 4: *reinterpret_cast< BlurPolicy*>(_v) = _t->blurPolicy(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<AbstractScrollArea *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setIndicatorColor(*reinterpret_cast< QColor*>(_v)); break;
        case 1: _t->setVerticalScrollIndicatorPolicy(*reinterpret_cast< ScrollIndicatorPolicy*>(_v)); break;
        case 2: _t->setHorizontalScrollIndicatorPolicy(*reinterpret_cast< ScrollIndicatorPolicy*>(_v)); break;
        case 3: _t->setBlurColor(*reinterpret_cast< QColor*>(_v)); break;
        case 4: _t->setBlurPolicy(*reinterpret_cast< BlurPolicy*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}